

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_hash_verify(psa_hash_operation_t *operation,uint8_t *hash,size_t hash_length)

{
  byte bVar1;
  psa_status_t pVar2;
  size_t sVar3;
  size_t actual_hash_length;
  uint8_t actual_hash [64];
  size_t local_60;
  byte local_58 [72];
  
  pVar2 = psa_hash_finish(operation,local_58,0x40,&local_60);
  if ((pVar2 == 0) && (pVar2 = -0x95, local_60 == hash_length)) {
    if (local_60 == 0) {
      pVar2 = 0;
    }
    else {
      bVar1 = 0;
      sVar3 = 0;
      do {
        bVar1 = bVar1 | local_58[sVar3] ^ hash[sVar3];
        sVar3 = sVar3 + 1;
      } while (local_60 != sVar3);
      pVar2 = -0x95;
      if (bVar1 == 0) {
        pVar2 = 0;
      }
    }
  }
  return pVar2;
}

Assistant:

psa_status_t psa_hash_verify( psa_hash_operation_t *operation,
                              const uint8_t *hash,
                              size_t hash_length )
{
    uint8_t actual_hash[MBEDTLS_MD_MAX_SIZE];
    size_t actual_hash_length;
    psa_status_t status = psa_hash_finish( operation,
                                           actual_hash, sizeof( actual_hash ),
                                           &actual_hash_length );
    if( status != PSA_SUCCESS )
        return( status );
    if( actual_hash_length != hash_length )
        return( PSA_ERROR_INVALID_SIGNATURE );
    if( safer_memcmp( hash, actual_hash, actual_hash_length ) != 0 )
        return( PSA_ERROR_INVALID_SIGNATURE );
    return( PSA_SUCCESS );
}